

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

spirv_cross * __thiscall
spirv_cross::join<char_const(&)[15],std::__cxx11::string,char_const(&)[3]>
          (spirv_cross *this,char (*ts) [15],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,char (*ts_2) [3])

{
  undefined1 local_1118 [8];
  StringStream<4096UL,_4096UL> stream;
  char (*ts_local_2) [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_1;
  char (*ts_local) [15];
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_2;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1118);
  inner::join_helper<char_const(&)[15],std::__cxx11::string,char_const(&)[3]>
            ((StringStream<4096UL,_4096UL> *)local_1118,ts,ts_1,
             (char (*) [3])stream.saved_buffers.stack_storage.aligned_char._184_8_);
  StringStream<4096ul,4096ul>::str_abi_cxx11_((StringStream<4096ul,4096ul> *)this);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1118);
  return this;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}